

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::image::anon_unknown_0::LoadStoreTest::createInstance(LoadStoreTest *this,Context *context)

{
  ImageType IVar1;
  Context *context_local;
  LoadStoreTest *this_local;
  
  IVar1 = Texture::type(&this->m_texture);
  if (IVar1 == IMAGE_TYPE_BUFFER) {
    this_local = (LoadStoreTest *)operator_new(0x128);
    BufferLoadStoreTestInstance::BufferLoadStoreTestInstance
              ((BufferLoadStoreTestInstance *)this_local,context,&this->m_texture,this->m_format,
               this->m_imageFormat,(bool)(this->m_declareImageFormatInShader & 1));
  }
  else {
    this_local = (LoadStoreTest *)operator_new(0x120);
    ImageLoadStoreTestInstance::ImageLoadStoreTestInstance
              ((ImageLoadStoreTestInstance *)this_local,context,&this->m_texture,this->m_format,
               this->m_imageFormat,(bool)(this->m_declareImageFormatInShader & 1),
               (bool)(this->m_singleLayerBind & 1));
  }
  return (TestInstance *)this_local;
}

Assistant:

TestInstance* LoadStoreTest::createInstance (Context& context) const
{
	if (m_texture.type() == IMAGE_TYPE_BUFFER)
		return new BufferLoadStoreTestInstance(context, m_texture, m_format, m_imageFormat, m_declareImageFormatInShader);
	else
		return new ImageLoadStoreTestInstance(context, m_texture, m_format, m_imageFormat, m_declareImageFormatInShader, m_singleLayerBind);
}